

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

LocalSet * __thiscall wasm::Builder::makeLocalSet(Builder *this,Index index,Expression *value)

{
  LocalSet *pLVar1;
  LocalSet *ret;
  Expression *value_local;
  Index index_local;
  Builder *this_local;
  
  pLVar1 = MixedArena::alloc<wasm::LocalSet>(&this->wasm->allocator);
  pLVar1->index = index;
  pLVar1->value = value;
  ::wasm::LocalSet::makeSet();
  ::wasm::LocalSet::finalize();
  return pLVar1;
}

Assistant:

LocalSet* makeLocalSet(Index index, Expression* value) {
    auto* ret = wasm.allocator.alloc<LocalSet>();
    ret->index = index;
    ret->value = value;
    ret->makeSet();
    ret->finalize();
    return ret;
  }